

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

ThisType * __thiscall
Gs::Matrix<float,_3UL,_3UL>::operator*=(Matrix<float,_3UL,_3UL> *this,ThisType *rhs)

{
  size_t c;
  long lVar1;
  float *pfVar2;
  size_t r;
  long lVar3;
  float *pfVar4;
  size_t i;
  long lVar5;
  float fVar6;
  Matrix<float,_3UL,_3UL> result;
  
  lVar1 = 0;
  do {
    lVar3 = 0;
    pfVar2 = this->m_;
    do {
      fVar6 = 0.0;
      lVar5 = 0;
      pfVar4 = pfVar2;
      do {
        fVar6 = fVar6 + *pfVar4 * *(float *)((long)rhs + lVar5 * 4);
        lVar5 = lVar5 + 1;
        pfVar4 = pfVar4 + 3;
      } while (lVar5 != 3);
      result.m_[lVar3 + lVar1 * 3] = fVar6;
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
    } while (lVar3 != 3);
    lVar1 = lVar1 + 1;
    rhs = (ThisType *)((long)rhs + 0xc);
  } while (lVar1 != 3);
  this->m_[8] = result.m_[8];
  *(undefined8 *)(this->m_ + 4) = result.m_._16_8_;
  *(undefined8 *)(this->m_ + 6) = result.m_._24_8_;
  *(undefined8 *)this->m_ = result.m_._0_8_;
  *(undefined8 *)(this->m_ + 2) = result.m_._8_8_;
  return this;
}

Assistant:

ThisType& operator *= (const ThisType& rhs)
        {
            GS_ASSERT_NxN_MATRIX;
            *this = (*this * rhs);
            return *this;
        }